

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetDeclarationSyntax,slang::syntax::NetDeclarationSyntax_const&>
          (BumpAllocator *this,NetDeclarationSyntax *args)

{
  NetDeclarationSyntax *this_00;
  
  this_00 = (NetDeclarationSyntax *)allocate(this,0xd0,8);
  slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }